

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O2

bc_slist_t * blogc_template_parse_from_file(char *f,bc_error_t **err)

{
  size_t in_RAX;
  char *src;
  bc_slist_t *pbVar1;
  size_t len;
  
  if (((err != (bc_error_t **)0x0) && (*err == (bc_error_t *)0x0)) &&
     (len = in_RAX, src = bc_file_get_contents(f,true,&len,err), src != (char *)0x0)) {
    pbVar1 = blogc_template_parse(src,len,err);
    free(src);
    return pbVar1;
  }
  return (bc_slist_t *)0x0;
}

Assistant:

bc_slist_t*
blogc_template_parse_from_file(const char *f, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t len;
    char *s = bc_file_get_contents(f, true, &len, err);
    if (s == NULL)
        return NULL;
    bc_slist_t *rv = blogc_template_parse(s, len, err);
    free(s);
    return rv;
}